

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O0

istream * XPMP2::safeGetline(istream *is,string *t)

{
  ulong uVar1;
  char *pcVar2;
  string *in_RSI;
  istream *in_RDI;
  
  std::getline<char,std::char_traits<char>,std::allocator<char>>(in_RDI,in_RSI,'\n');
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == '\r') {
      std::__cxx11::string::pop_back();
    }
  }
  return in_RDI;
}

Assistant:

std::istream& safeGetline(std::istream& is, std::string& t)
{
    // read a line until LF
    std::getline(is, t, '\n');
    
    // if last character is CR then remove it
    if (!t.empty() && t.back() == '\r')
        t.pop_back();
    
    return is;
}